

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.hpp
# Opt level: O1

void __thiscall
covec::Covec<float>::
accumulate_grad<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>>
          (Covec<float> *this,
          vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
          *grad,vector<unsigned_long,_std::allocator<unsigned_long>_> *sample,POS_NEG pos_neg,
          size_t K)

{
  long *plVar1;
  float fVar2;
  pointer psVar3;
  pointer psVar4;
  pointer puVar5;
  pointer psVar6;
  pointer psVar7;
  unsigned_long uVar8;
  long lVar9;
  pointer ppVar10;
  unsigned_long uVar11;
  unsigned_long uVar12;
  ulong uVar13;
  long lVar14;
  pointer pfVar15;
  long lVar16;
  size_t sVar17;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar18;
  vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
  *pvVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  size_t I;
  vector<float,_std::allocator<float>_> Hadamard_product;
  allocator_type local_89;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_88;
  long local_80;
  vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
  *local_78;
  float local_6c;
  ulong local_68;
  long local_60;
  Covec<float> *local_58;
  value_type_conflict3 local_4c;
  vector<float,_std::allocator<float>_> local_48;
  
  if ((long)(this->num_entries_).
            super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->num_entries_).
            super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    local_4c = 1.0;
    local_88 = sample;
    std::vector<float,_std::allocator<float>_>::vector(&local_48,this->dim_,&local_4c,&local_89);
    psVar3 = (this->num_entries_).
             super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (this->num_entries_).
             super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_80 = (long)psVar4 - (long)psVar3 >> 4;
    if (psVar4 != psVar3) {
      puVar5 = (local_88->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start;
      psVar6 = (this->vs_).
               super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar7 = (this->cs_).
               super__Vector_base<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar16 = 0;
      do {
        uVar8 = puVar5[lVar16];
        plVar1 = (long *)(*(long *)&(psVar7[lVar16].
                                     super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         + uVar8 * 8);
        *plVar1 = *plVar1 + 1;
        if (K != 0) {
          lVar9 = *(long *)(*(long *)&(psVar6[lVar16].
                                       super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->
                                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                           + uVar8 * 0x18);
          sVar17 = 0;
          do {
            local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[sVar17] =
                 *(float *)(lVar9 + sVar17 * 4) *
                 local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar17];
            sVar17 = sVar17 + 1;
          } while (K != sVar17);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != local_80 + (ulong)(local_80 == 0));
    }
    if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      fVar20 = 0.0;
    }
    else {
      fVar20 = 0.0;
      pfVar15 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        fVar20 = fVar20 + *pfVar15;
        pfVar15 = pfVar15 + 1;
      } while (pfVar15 !=
               local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    local_78 = grad;
    fVar20 = expf(-fVar20);
    fVar20 = 1.0 / (fVar20 + 1.0);
    if (pos_neg == POSITIVE) {
      fVar20 = 1.0 - fVar20;
    }
    else {
      fVar20 = -fVar20;
    }
    if (psVar4 != psVar3) {
      puVar5 = (local_88->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start;
      psVar6 = (this->vs_).
               super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar18 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                (this->cs_).
                super__Vector_base<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar10 = (local_78->
                super__Vector_base<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar19 = (vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
                 *)(K + 1);
      local_60 = K * 4;
      local_68 = ~K;
      local_80 = local_80 + (ulong)(local_80 == 0);
      lVar16 = 0;
      local_88 = pvVar18;
      local_78 = pvVar19;
      local_6c = fVar20;
      local_58 = this;
      do {
        uVar8 = puVar5[lVar16];
        uVar11 = *(&(pvVar18->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start)[lVar16 * 2];
        plVar1 = (long *)(uVar11 + uVar8 * 8);
        *plVar1 = *plVar1 + 1;
        uVar12 = puVar5[lVar16];
        lVar9 = *(long *)&(psVar6[lVar16].
                           super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ;
        ppVar10[lVar16].first = uVar12;
        uVar13 = *(ulong *)(uVar11 + uVar8 * 8);
        if (uVar13 < 100000) {
          fVar21 = ((float)(long)(100000 - uVar13) * (this->eta0_ - this->eta1_)) / 100000.0 +
                   this->eta1_;
        }
        else {
          fVar21 = this->eta1_;
        }
        if (K != 0) {
          lVar14 = *(long *)&ppVar10[lVar16].second.
                             super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data;
          sVar17 = 0;
          do {
            fVar2 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar17];
            fVar22 = 0.0;
            if ((fVar2 != 0.0) || (NAN(fVar2))) {
              fVar22 = (fVar2 * fVar21 * fVar20) /
                       *(float *)(*(long *)(uVar12 * 0x18 + lVar9) + sVar17 * 4);
            }
            *(float *)(lVar14 + sVar17 * 4) = fVar22;
            sVar17 = sVar17 + 1;
          } while (K != sVar17);
        }
        if (pvVar19 < (vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
                       *)this->dim_) {
          memset((void *)(*(long *)&ppVar10[lVar16].second.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data + local_60 + 4),0,
                 ((long)&(((vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
                            *)this->dim_)->
                         super__Vector_base<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_68) * 4);
          pvVar18 = local_88;
          pvVar19 = local_78;
          this = local_58;
          fVar20 = local_6c;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != local_80);
    }
    if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return;
  }
  accumulate_grad_2<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>>
            (this,grad,sample,pos_neg,K);
  return;
}

Assistant:

void Covec<Real>::accumulate_grad(Grad& grad
                                    , const std::vector<std::size_t>& sample
                                    , const typename Covec::POS_NEG pos_neg
				    , const std::size_t K)
  {
    assert( sample.size() == this->order() );

    if( this->order() == 2 ){
      return accumulate_grad_2(grad, sample, pos_neg, K);
    }

    // count the occurences and
    // compute Hadamard product, inner_product, sigmoid of inner_product
    std::vector<Real> Hadamard_product(this->dimension(), 1.0);
    for(std::size_t i = 0, I = this->order(); i < I; ++i){
      const auto j = sample[i];
      ++(*this->cs_[i])[j];
      const auto& v = (*this->vs_[i])[j];
      assert( v.size() == this->dimension() );
      for(std::size_t k = 0; k < K; ++k){
        Hadamard_product[k] *= v[k];
      }
    }
    Real inner_product =
      static_cast<Real>(std::accumulate(Hadamard_product.begin(), Hadamard_product.end(), 0.0));
    Real sigmoid = static_cast<Real>( 1.0 / ( 1 + std::exp(-inner_product) ) );
    Real coeff = (pos_neg == POSITIVE ? 1 - sigmoid : -sigmoid);

    // compute gradients
    for(std::size_t i = 0, I = this->order(); i < I; ++i){
      const auto& j = sample[i];
      auto& cs_ij = (*this->cs_[i])[j];
      ++cs_ij;
      const auto& v = (*this->vs_[i])[j];
      auto& grad_i = grad[i];
      grad_i.first = j;
      auto& g = grad_i.second;
      auto eta = this->next_eta(cs_ij);
      const auto C = coeff * eta;
      for(std::size_t k = 0; k < K; ++k){
        if( Hadamard_product[k] == 0 ){
	  g[k] = 0;
	  continue;
	}
        g[k] = C * Hadamard_product[k] / v[k];
      }
      for(std::size_t k = K + 1; k < this->dimension(); ++k){
	g[k] = 0;
      }
    }

  }